

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_to_mask(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 arg1;
  TCGv_i32 val;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  arg1 = gen_ea(env,s,insn,2,tcg_ctx_00->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (arg1 == tcg_ctx_00->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    tcg_gen_ori_i32_m68k(tcg_ctx_00,QREG_MAC_MASK,arg1,-0x10000);
  }
  return;
}

Assistant:

DISAS_INSN(to_mask)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv val;
    SRC_EA(env, val, OS_LONG, 0, NULL);
    tcg_gen_ori_i32(tcg_ctx, QREG_MAC_MASK, val, 0xffff0000);
}